

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void parse_mask_regressor_args
               (vw *all,string *feature_mask,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *initial_regressors)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  pointer pbVar3;
  uint32_t uVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  weight *pwVar7;
  string file_options;
  io_buf io_temp_mask;
  io_buf io_temp;
  string local_198;
  io_buf local_178;
  io_buf local_d0;
  
  paVar2 = &local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  __n = feature_mask->_M_string_length;
  local_198._M_dataplus._M_p = (pointer)paVar2;
  if (__n != 0) {
    pbVar3 = (initial_regressors->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((initial_regressors->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish != pbVar3) && (__n == pbVar3->_M_string_length)
       ) {
      iVar5 = bcmp((feature_mask->_M_dataplus)._M_p,(pbVar3->_M_dataplus)._M_p,__n);
      if (iVar5 == 0) goto LAB_0022c767;
    }
    local_178._vptr_io_buf = (_func_int **)&PTR_open_file_002ccfa8;
    local_178.space._begin = (char *)0x0;
    local_178.space._end = (char *)0x0;
    local_178.space.end_array = (char *)0x0;
    local_178.space.erase_count = 0;
    local_178.files._begin = (int *)0x0;
    local_178.files._end = (int *)0x0;
    local_178.files.end_array = (int *)0x0;
    local_178.files.erase_count = 0;
    local_178.currentname._begin = (char *)0x0;
    local_178.currentname._end = (char *)0x0;
    local_178.currentname.end_array = (char *)0x0;
    local_178.currentname.erase_count = 0;
    local_178.finalname._begin = (char *)0x0;
    local_178.finalname._end = (char *)0x0;
    local_178.finalname.end_array = (char *)0x0;
    local_178.finalname.erase_count = 0;
    v_array<char>::resize(&local_178.space,0x10000);
    local_178.count = 0;
    local_178.current = 0;
    local_178.head = local_178.space._begin;
    local_178._verify_hash = false;
    local_178._hash = 0;
    io_buf::open_file(&local_178,(feature_mask->_M_dataplus)._M_p,false,1);
    save_load_header(all,&local_178,true,false,&local_198,all->options);
    LEARNER::learner<char,_char>::save_load(all->l,&local_178,true,false);
    if (local_178.files._end != local_178.files._begin) {
      piVar1 = local_178.files._end + -1;
      local_178.files._end = local_178.files._end + -1;
      io_buf::close_file_or_socket(*piVar1);
    }
    if ((initial_regressors->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (initial_regressors->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_d0._vptr_io_buf = (_func_int **)&PTR_open_file_002ccfa8;
      local_d0.space._begin = (char *)0x0;
      local_d0.space._end = (char *)0x0;
      local_d0.space.end_array = (char *)0x0;
      local_d0.space.erase_count = 0;
      local_d0.files._begin = (int *)0x0;
      local_d0.files._end = (int *)0x0;
      local_d0.files.end_array = (int *)0x0;
      local_d0.files.erase_count = 0;
      local_d0.currentname._begin = (char *)0x0;
      local_d0.currentname._end = (char *)0x0;
      local_d0.currentname.end_array = (char *)0x0;
      local_d0.currentname.erase_count = 0;
      local_d0.finalname._begin = (char *)0x0;
      local_d0.finalname._end = (char *)0x0;
      local_d0.finalname.end_array = (char *)0x0;
      local_d0.finalname.erase_count = 0;
      v_array<char>::resize(&local_d0.space,0x10000);
      local_d0.count = 0;
      local_d0.current = 0;
      local_d0.head = local_d0.space._begin;
      local_d0._verify_hash = false;
      local_d0._hash = 0;
      io_buf::open_file(&local_d0,
                        (((initial_regressors->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false,1);
      save_load_header(all,&local_d0,true,false,&local_198,all->options);
      if (local_d0.files._end != local_d0.files._begin) {
        piVar1 = local_d0.files._end + -1;
        local_d0.files._end = local_d0.files._end + -1;
        io_buf::close_file_or_socket(*piVar1);
      }
      if ((all->weights).sparse == true) {
        for (p_Var6 = (all->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
            p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
          *(undefined4 *)&(p_Var6[2]._M_nxt)->_M_nxt = 0;
        }
      }
      else {
        pwVar7 = (all->weights).dense_weights._begin;
        if (pwVar7 != pwVar7 + (all->weights).dense_weights._weight_mask + 1) {
          uVar4 = (all->weights).dense_weights._stride_shift;
          do {
            *pwVar7 = 0.0;
            pwVar7 = pwVar7 + (1L << ((byte)uVar4 & 0x3f));
          } while (pwVar7 != (all->weights).dense_weights._begin +
                             (all->weights).dense_weights._weight_mask + 1);
        }
      }
      io_buf::~io_buf(&local_d0);
    }
    io_buf::~io_buf(&local_178);
  }
LAB_0022c767:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_mask_regressor_args(vw& all, std::string feature_mask, std::vector<std::string> initial_regressors)
{
  // TODO does this extra check need to be used? I think it is duplicated but there may be some logic I am missing.
  std::string file_options;
  if (!feature_mask.empty())
  {
    if (initial_regressors.size() > 0)
    {
      if (feature_mask == initial_regressors[0])  //-i and -mask are from same file, just generate mask
      {
        return;
      }
    }

    // all other cases, including from different file, or -i does not exist, need to read in the mask file
    io_buf io_temp_mask;
    io_temp_mask.open_file(feature_mask.c_str(), false, io_buf::READ);
    save_load_header(all, io_temp_mask, true, false, file_options, *all.options);
    all.l->save_load(io_temp_mask, true, false);
    io_temp_mask.close_file();

    // Deal with the over-written header from initial regressor
    if (initial_regressors.size() > 0)
    {
      // Load original header again.
      io_buf io_temp;
      io_temp.open_file(initial_regressors[0].c_str(), false, io_buf::READ);
      save_load_header(all, io_temp, true, false, file_options, *all.options);
      io_temp.close_file();

      // Re-zero the weights, in case weights of initial regressor use different indices
      all.weights.set_zero(0);
    }
    else
    {
      // If no initial regressor, just clear out the options loaded from the header.
      // TODO clear file options
      // all.opts_n_args.file_options.str("");
    }
  }
}